

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorComboBox.cpp
# Opt level: O2

void __thiscall QColorComboBoxPrivate::~QColorComboBoxPrivate(QColorComboBoxPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x20);
  return;
}

Assistant:

class QColorComboBoxPrivate : public QObject {
    Q_OBJECT

public:
    explicit QColorComboBoxPrivate(QColorComboBox *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , model(new QColorListModel(this)) {
        Q_ASSERT(widget);

        widget->setModel(model);
        updateValidator();

        connect(widget, &QComboBox::textActivated, this, &QColorComboBoxPrivate::textActivated);
        connect(widget, qOverload<int>(&QComboBox::currentIndexChanged), this,
                &QColorComboBoxPrivate::currentIndexChanged);
        connect(widget, &QComboBox::currentTextChanged, this, &QColorComboBoxPrivate::currentTextChanged);
        connect(widget, &QComboBox::editTextChanged, this, &QColorComboBoxPrivate::editTextChanged);
        connect(widget, &QComboBox::textHighlighted, this, &QColorComboBoxPrivate::textHighlighted);
    }

    void updateValidator() {
        if (widget->lineEdit()) {
            QString mask = QStringLiteral("\\#HHHhhh");

            if (model->nameFormat() == QColorListModel::NameFormat::HexArgb) {
                mask = QStringLiteral("\\#HHHhhhhh");
            }

            if (widget->lineEdit()->inputMask() != mask) {
                widget->lineEdit()->setInputMask(mask);
            }
        }
    }